

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

ostream * GEO::Logger::err(string *feature)

{
  Logger *this;
  ostream *poVar1;
  
  if ((instance_ != 0) && (::(anonymous_namespace)::running_threads_invocations_ < 1)) {
    this = instance();
    poVar1 = err_stream(this,feature);
    return poVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(E)-[",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(feature->_M_dataplus)._M_p,feature->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
  return poVar1;
}

Assistant:

std::ostream& Logger::err(const std::string& feature) {
	std::ostream& result = 
	    (is_initialized() && !Process::is_running_threads()) ?	    
            instance()->err_stream(feature) :
            (std::cerr << "(E)-[" << feature << "] ");
	return result;
    }